

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2ModDel::renderChan(V2ModDel *this,StereoSample *chanbuf,int nsamples)

{
  float dry_00;
  int local_24;
  int i;
  float dry;
  int nsamples_local;
  StereoSample *chanbuf_local;
  V2ModDel *this_local;
  
  if ((this->wetout != 0.0) || (NAN(this->wetout))) {
    dry_00 = this->dryout;
    for (local_24 = 0; local_24 < nsamples; local_24 = local_24 + 1) {
      processSample(this,chanbuf + local_24,chanbuf[local_24].field_0.l + 3.8146973e-06,
                    *(float *)((long)chanbuf + (long)local_24 * 8 + 4) + 3.8146973e-06,dry_00);
    }
  }
  return;
}

Assistant:

void renderChan(StereoSample *chanbuf, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL chan");

        float dry = dryout;
        for (int i=0; i < nsamples; i++)
            processSample(&chanbuf[i], chanbuf[i].l + fcdcoffset, chanbuf[i].r + fcdcoffset, dry);
    }